

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

ExtensionalityClause * __thiscall
Lib::List<Saturation::ExtensionalityClause>::DelIterator::next(DelIterator *this)

{
  List<Saturation::ExtensionalityClause> *pLVar1;
  undefined8 *in_RSI;
  ExtensionalityClause *in_RDI;
  
  if (in_RSI[2] == 0) {
    in_RSI[2] = *(undefined8 *)*in_RSI;
  }
  else {
    in_RSI[1] = in_RSI[2];
    pLVar1 = List<Saturation::ExtensionalityClause>::tail
                       ((List<Saturation::ExtensionalityClause> *)in_RSI[2]);
    in_RSI[2] = pLVar1;
  }
  List<Saturation::ExtensionalityClause>::head
            (in_RDI,(List<Saturation::ExtensionalityClause> *)in_RSI[2]);
  return in_RDI;
}

Assistant:

C next()
    {
      if (_cur) { // there was an element previously returned by next()
	_prev = _cur;
	_cur = _cur->tail();
	ASS_NEQ(_cur,0);
      }
      else { // result must be the first element of the list
	_cur = _lst;
      }
      return _cur->head();
    }